

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_materials.cxx
# Opt level: O0

void __thiscall
level_mesh::update_span
          (level_mesh *this,b_span *span,uint_fast32_t v0,uint_fast32_t v1,fvector3 *normal,
          uint16_t gamemtl)

{
  bool bVar1;
  size_type sVar2;
  pointer pbVar3;
  b_neighbour local_68;
  __normal_iterator<b_neighbour_*,_std::vector<b_neighbour,_std::allocator<b_neighbour>_>_> local_58
  ;
  __normal_iterator<const_b_neighbour_*,_std::vector<b_neighbour,_std::allocator<b_neighbour>_>_>
  local_50;
  b_neighbour_vec_cit end;
  __normal_iterator<const_b_neighbour_*,_std::vector<b_neighbour,_std::allocator<b_neighbour>_>_>
  local_40;
  b_neighbour_vec_cit it;
  bool side;
  uint16_t gamemtl_local;
  fvector3 *normal_local;
  uint_fast32_t v1_local;
  uint_fast32_t v0_local;
  b_span *span_local;
  level_mesh *this_local;
  
  it._M_current._6_2_ = gamemtl;
  bVar1 = std::vector<b_neighbour,_std::allocator<b_neighbour>_>::empty
                    (&span->super_b_neighbour_vec);
  if (bVar1) {
    span->v0 = (uint32_t)v0;
    span->v1 = (uint32_t)v1;
    span->border = true;
    it._M_current._5_1_ = 1;
  }
  else {
    if (v0 == span->v0) {
      if (v1 != span->v1) {
        __assert_fail("v1 == span.v1",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh_materials.cxx"
                      ,0x100,
                      "void level_mesh::update_span(b_span &, uint_fast32_t, uint_fast32_t, const fvector3 *, uint16_t)"
                     );
      }
      it._M_current._5_1_ = 1;
    }
    else {
      bVar1 = false;
      if (v0 == span->v1) {
        bVar1 = v1 == span->v0;
      }
      if (!bVar1) {
        __assert_fail("v0 == span.v1 && v1 == span.v0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh_materials.cxx"
                      ,0x103,
                      "void level_mesh::update_span(b_span &, uint_fast32_t, uint_fast32_t, const fvector3 *, uint16_t)"
                     );
      }
      it._M_current._5_1_ = 0;
    }
    sVar2 = std::vector<b_neighbour,_std::allocator<b_neighbour>_>::size
                      (&span->super_b_neighbour_vec);
    if (sVar2 == 1) {
      span->border = false;
    }
    end._M_current =
         (b_neighbour *)
         std::vector<b_neighbour,_std::allocator<b_neighbour>_>::begin(&span->super_b_neighbour_vec)
    ;
    __gnu_cxx::
    __normal_iterator<b_neighbour_const*,std::vector<b_neighbour,std::allocator<b_neighbour>>>::
    __normal_iterator<b_neighbour*>
              ((__normal_iterator<b_neighbour_const*,std::vector<b_neighbour,std::allocator<b_neighbour>>>
                *)&local_40,
               (__normal_iterator<b_neighbour_*,_std::vector<b_neighbour,_std::allocator<b_neighbour>_>_>
                *)&end);
    local_58._M_current =
         (b_neighbour *)
         std::vector<b_neighbour,_std::allocator<b_neighbour>_>::end(&span->super_b_neighbour_vec);
    __gnu_cxx::
    __normal_iterator<b_neighbour_const*,std::vector<b_neighbour,std::allocator<b_neighbour>>>::
    __normal_iterator<b_neighbour*>
              ((__normal_iterator<b_neighbour_const*,std::vector<b_neighbour,std::allocator<b_neighbour>>>
                *)&local_50,&local_58);
    while (bVar1 = __gnu_cxx::operator!=(&local_40,&local_50), bVar1) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_b_neighbour_*,_std::vector<b_neighbour,_std::allocator<b_neighbour>_>_>
               ::operator->(&local_40);
      if (pbVar3->gamemtl != it._M_current._6_2_) {
        span->border = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_b_neighbour_*,_std::vector<b_neighbour,_std::allocator<b_neighbour>_>_>
      ::operator++(&local_40);
    }
  }
  b_neighbour::b_neighbour(&local_68,normal,it._M_current._6_2_,(bool)(it._M_current._5_1_ & 1));
  std::vector<b_neighbour,_std::allocator<b_neighbour>_>::push_back
            (&span->super_b_neighbour_vec,&local_68);
  return;
}

Assistant:

void level_mesh::update_span(b_span& span, uint_fast32_t v0, uint_fast32_t v1,
		const fvector3* normal, uint16_t gamemtl)
{
	bool side;
	if (span.empty()) {
		span.v0 = uint32_t(v0 & UINT32_MAX);
		span.v1 = uint32_t(v1 & UINT32_MAX);
		span.border = true;
		side = true;
	} else {
		if (v0 == span.v0) {
			xr_assert(v1 == span.v1);
			side = true;
		} else {
			xr_assert(v0 == span.v1 && v1 == span.v0);
			side = false;
		}
		if (span.size() == 1)
			span.border = false;
		for (b_neighbour_vec_cit it = span.begin(),
				end = span.end(); it != end; ++it) {
			if (it->gamemtl != gamemtl) {
				span.border = true;
				break;
			}
		}
	}
	span.push_back(b_neighbour(normal, gamemtl, side));
}